

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O3

hd_stream * hd_open_concat(hd_context *ctx,int len,int pad)

{
  int *state;
  hd_stream *phVar1;
  
  state = (int *)hd_calloc(ctx,1,(long)len * 8 + 0x18);
  *state = len;
  state[1] = 0;
  state[2] = 0;
  state[3] = pad;
  *(undefined1 *)(state + 4) = 0x20;
  phVar1 = hd_new_stream(ctx,state,next_concat,close_concat);
  return phVar1;
}

Assistant:

hd_stream *
hd_open_concat(hd_context *ctx, int len, int pad)
{
    struct concat_filter *state;

    state = hd_calloc(ctx, 1, sizeof(struct concat_filter) + (len-1)*sizeof(hd_stream *));
    state->max = len;
    state->count = 0;
    state->current = 0;
    state->pad = pad;
    state->ws_buf = 32;

    return hd_new_stream(ctx, state, next_concat, close_concat);
}